

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O3

sysbvm_tuple_t sysbvm_integer_negated(sysbvm_context_t *context,sysbvm_tuple_t integer)

{
  sysbvm_integer_t *integer_00;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  long lVar3;
  ulong immediateTypeTag;
  
  if ((integer & 0xf) == 0) {
    integer_00 = (sysbvm_integer_t *)sysbvm_context_shallowCopy(context,integer);
    immediateTypeTag = (ulong)integer_00 & 0xf;
    if (immediateTypeTag == 0 && integer_00 != (sysbvm_integer_t *)0x0) {
      sVar1 = (integer_00->header).field_0.typePointer;
    }
    else if ((int)immediateTypeTag == 0xf) {
      sVar1 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)integer_00 >> 4);
    }
    else {
      sVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
    }
    sVar2 = (context->roots).largePositiveIntegerType;
    if (sVar1 == sVar2) {
      sVar2 = (context->roots).largeNegativeIntegerType;
    }
    (integer_00->header).field_0.typePointer = sVar2;
    sVar1 = sysbvm_integer_normalize(context,integer_00);
    return sVar1;
  }
  lVar3 = (long)integer >> 4;
  if (lVar3 + 0x7ffffffffffffffU >> 0x3c == 0) {
    return lVar3 * -0x10 + 1;
  }
  sVar1 = sysbvm_tuple_integer_encodeBigInt64(context,-lVar3);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_negated(sysbvm_context_t *context, sysbvm_tuple_t integer)
{
    if(sysbvm_tuple_isImmediate(integer))
    {
        sysbvm_stuple_t integerValue = sysbvm_tuple_integer_decodeSmall(integer);
        return sysbvm_tuple_integer_encodeInt64(context, -integerValue);
    }

    // Shallow copy and swap the integer type.
    sysbvm_tuple_t negatedInteger = sysbvm_context_shallowCopy(context, integer);
    sysbvm_tuple_t integerType = sysbvm_tuple_getType(context, negatedInteger);
    sysbvm_tuple_setType(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(negatedInteger), integerType == context->roots.largePositiveIntegerType ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType);
    return sysbvm_integer_normalize(context, (sysbvm_integer_t*)negatedInteger);
}